

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction_widgets.cpp
# Opt level: O1

void __thiscall QtWidgetsActionPrivate::setMenu(QtWidgetsActionPrivate *this,QObject *menu)

{
  QAction *a;
  Data *pDVar1;
  QObject *pQVar2;
  Data *pDVar3;
  
  a = *(QAction **)&this->field_0x8;
  pQVar2 = (QObject *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  pDVar3 = (this->m_menu).wp.d;
  if (((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
     ((this->m_menu).wp.value != (QObject *)0x0)) {
    QMenuPrivate::setOverrideMenuAction
              (*(QMenuPrivate **)((this->m_menu).wp.value + 8),(QAction *)0x0);
  }
  if (pQVar2 == (QObject *)0x0) {
    pDVar3 = (Data *)0x0;
  }
  else {
    pDVar3 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar2);
  }
  pDVar1 = (this->m_menu).wp.d;
  (this->m_menu).wp.d = pDVar3;
  (this->m_menu).wp.value = pQVar2;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      operator_delete(pDVar1);
    }
  }
  pDVar3 = (this->m_menu).wp.d;
  if (((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
     ((this->m_menu).wp.value != (QObject *)0x0)) {
    QMenuPrivate::setOverrideMenuAction(*(QMenuPrivate **)((this->m_menu).wp.value + 8),a);
  }
  QActionPrivate::sendDataChanged();
  return;
}

Assistant:

void QtWidgetsActionPrivate::setMenu(QObject *menu)
{
    Q_Q(QAction);
    QMenu *theMenu = qobject_cast<QMenu*>(menu);
    Q_ASSERT_X(!menu || theMenu, "QAction::setMenu",
               "QAction::setMenu expects a QMenu* in widget applications");
    if (m_menu)
        m_menu->d_func()->setOverrideMenuAction(nullptr); //we reset the default action of any previous menu
    m_menu = theMenu;
    if (m_menu)
        m_menu->d_func()->setOverrideMenuAction(q);
    sendDataChanged();
}